

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

bool Assimp::Blender::read<Assimp::Blender::MTexPoly>
               (Structure *s,MTexPoly *p,size_t cnt,FileDatabase *db)

{
  undefined1 local_50 [8];
  MTexPoly read;
  size_t i;
  FileDatabase *db_local;
  size_t cnt_local;
  MTexPoly *p_local;
  Structure *s_local;
  
  read.flag = '\0';
  read.transp = '\0';
  read.mode = 0;
  read.tile = 0;
  read.pad = 0;
  cnt_local = (size_t)p;
  for (; (ulong)read._24_8_ < cnt; read._24_8_ = read._24_8_ + 1) {
    MTexPoly::MTexPoly((MTexPoly *)local_50);
    Structure::Convert<Assimp::Blender::MTexPoly>(s,(MTexPoly *)local_50,db);
    MTexPoly::operator=((MTexPoly *)cnt_local,(MTexPoly *)local_50);
    cnt_local = cnt_local + 0x20;
    MTexPoly::~MTexPoly((MTexPoly *)local_50);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }